

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

float ScaleSumSamples_C(float *src,float *dst,float scale,int width)

{
  float fVar1;
  float v;
  int i;
  float fsum;
  int width_local;
  float scale_local;
  float *dst_local;
  float *src_local;
  
  fsum = 0.0;
  dst_local = dst;
  src_local = src;
  for (i = 0; i < width; i = i + 1) {
    fVar1 = *src_local;
    fsum = fVar1 * fVar1 + fsum;
    *dst_local = fVar1 * scale;
    dst_local = dst_local + 1;
    src_local = src_local + 1;
  }
  return fsum;
}

Assistant:

float ScaleSumSamples_C(const float* src, float* dst, float scale, int width) {
  float fsum = 0.f;
  int i;
  for (i = 0; i < width; ++i) {
    float v = *src++;
    fsum += v * v;
    *dst++ = v * scale;
  }
  return fsum;
}